

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

pair<int,_int> __thiscall imrt::Station::getPos(Station *this,int index)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  pair<int,_int> pVar5;
  mapped_type in_ESI;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *unaff_retaddr;
  iterator pos;
  int in_stack_00000030;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *in_stack_ffffffffffffffb8;
  pair<int,_int> local_30;
  _Self local_28;
  _Self local_20;
  mapped_type local_14;
  key_type *in_stack_fffffffffffffff8;
  mapped_type mVar6;
  
  local_14 = in_ESI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type_conflict *)0x13ef28);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_30 = Collimator::indexToPos((Collimator *)this,index,in_stack_00000030);
    pmVar2 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[](unaff_retaddr,&in_stack_fffffffffffffff8->first);
    std::pair<int,_int>::operator=(pmVar2,&local_30);
    std::
    map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
    ::operator[](unaff_retaddr,&in_stack_fffffffffffffff8->first);
    pmVar3 = std::
             map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
             ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                           *)unaff_retaddr,in_stack_fffffffffffffff8);
    *pmVar3 = local_14;
    pmVar2 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[](unaff_retaddr,&in_stack_fffffffffffffff8->first);
    mVar6 = *pmVar2;
  }
  else {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_int>_>_> *)0x13f002);
    mVar6.first = (ppVar4->second).first;
    mVar6.second = (ppVar4->second).second;
  }
  pVar5.first = mVar6.first;
  pVar5.second = mVar6.second;
  return pVar5;
}

Assistant:

pair<int,int> Station::getPos(int index) const{
    auto pos = beam2pos.find(index);
    if(pos==beam2pos.end()){
      beam2pos[index]=collimator.indexToPos(index, angle);
      pos2beam[beam2pos[index]]=index;
      return beam2pos[index];
    }
    return(pos->second);
  }